

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.hpp
# Opt level: O0

ExecValueAccess __thiscall rsg::Expression::getLValue(Expression *this)

{
  Exception *this_00;
  allocator<char> local_31;
  string local_30;
  Expression *local_10;
  Expression *this_local;
  
  local_10 = this;
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Expression::getLValue(): not L-value node",&local_31);
  Exception::Exception(this_00,&local_30);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

virtual ExecValueAccess			getLValue			(void) const { DE_ASSERT(DE_FALSE); throw Exception("Expression::getLValue(): not L-value node"); }